

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign96.c
# Opt level: O1

size_t bign96Start_keep(bign96_deep_i deep)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  
  sVar1 = gfpCreate_keep(0x18);
  sVar2 = gfpCreate_deep(0x18);
  sVar3 = ecpCreateJ_keep(3);
  sVar4 = ecpCreateJ_deep(3,sVar2);
  sVar5 = ecCreateGroup_deep(sVar2);
  if (deep == (bign96_deep_i)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = (*deep)(3,sVar2,3,sVar4);
  }
  sVar2 = utilMax(3,sVar4,sVar5,sVar2);
  return sVar2 + sVar3 + sVar1;
}

Assistant:

size_t bign96Start_keep(bign96_deep_i deep)
{
	// размерности
	size_t n = W_OF_B(192);
	size_t f_keep = gfpCreate_keep(24);
	size_t f_deep = gfpCreate_deep(24);
	size_t ec_d = 3;
	size_t ec_keep = ecpCreateJ_keep(n);
	size_t ec_deep = ecpCreateJ_deep(n, f_deep);
	// расчет
	return f_keep + ec_keep +
		utilMax(3,
			ec_deep,
			ecCreateGroup_deep(f_deep),
			deep ? deep(n, f_deep, ec_d, ec_deep) : 0);
}